

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O3

int uv_tty_init(uv_loop_t *loop,uv_tty_t *tty,int fd,int readable)

{
  uv_handle_type uVar1;
  int iVar2;
  int iVar3;
  char path [256];
  char acStack_138 [264];
  
  uVar1 = uv_guess_handle(fd);
  if (uVar1 == UV_UNKNOWN_HANDLE) {
    return -0x16;
  }
  if (uVar1 == UV_FILE) {
    return -0x16;
  }
  iVar2 = fd;
  if (uVar1 == UV_TTY) {
    iVar2 = ioctl(fd,0x80045430,acStack_138);
    if (((iVar2 != 0) && (iVar2 = ttyname_r(fd,acStack_138,0x100), iVar2 == 0)) &&
       (iVar2 = uv__open_cloexec(acStack_138,2), -1 < iVar2)) {
      iVar3 = uv__dup2_cloexec(iVar2,fd);
      if (iVar3 != -0x16 && iVar3 < 0) {
        uv__close(iVar2);
        return iVar3;
      }
      goto LAB_0053509e;
    }
    uv__stream_init(loop,(uv_stream_t *)tty,UV_TTY);
    iVar2 = fd;
    if (readable == 0) {
      iVar3 = 0x80;
      goto LAB_005350bd;
    }
  }
  else {
LAB_0053509e:
    uv__stream_init(loop,(uv_stream_t *)tty,UV_TTY);
  }
  uv__nonblock_ioctl(iVar2,1);
  iVar3 = 0;
LAB_005350bd:
  uv__stream_open((uv_stream_t *)tty,iVar2,(uint)(readable == 0) * 0x20 + iVar3 + 0x20);
  tty->mode = 0;
  return 0;
}

Assistant:

int uv_tty_init(uv_loop_t* loop, uv_tty_t* tty, int fd, int readable) {
  uv_handle_type type;
  int flags = 0;
  int newfd = -1;
  int r;
  int saved_flags;
  char path[256];

  /* File descriptors that refer to files cannot be monitored with epoll.
   * That restriction also applies to character devices like /dev/random
   * (but obviously not /dev/tty.)
   */
  type = uv_guess_handle(fd);
  if (type == UV_FILE || type == UV_UNKNOWN_HANDLE)
    return -EINVAL;

  /* Reopen the file descriptor when it refers to a tty. This lets us put the
   * tty in non-blocking mode without affecting other processes that share it
   * with us.
   *
   * Example: `node | cat` - if we put our fd 0 in non-blocking mode, it also
   * affects fd 1 of `cat` because both file descriptors refer to the same
   * struct file in the kernel. When we reopen our fd 0, it points to a
   * different struct file, hence changing its properties doesn't affect
   * other processes.
   */
  if (type == UV_TTY) {
    /* Reopening a pty in master mode won't work either because the reopened
     * pty will be in slave mode (*BSD) or reopening will allocate a new
     * master/slave pair (Linux). Therefore check if the fd points to a
     * slave device.
     */
    if (uv__tty_is_slave(fd) && ttyname_r(fd, path, sizeof(path)) == 0)
      r = uv__open_cloexec(path, O_RDWR);
    else
      r = -1;

    if (r < 0) {
      /* fallback to using blocking writes */
      if (!readable)
        flags |= UV_STREAM_BLOCKING;
      goto skip;
    }

    newfd = r;

    r = uv__dup2_cloexec(newfd, fd);
    if (r < 0 && r != -EINVAL) {
      /* EINVAL means newfd == fd which could conceivably happen if another
       * thread called close(fd) between our calls to isatty() and open().
       * That's a rather unlikely event but let's handle it anyway.
       */
      uv__close(newfd);
      return r;
    }

    fd = newfd;
  }

#if defined(__APPLE__)
  /* Save the fd flags in case we need to restore them due to an error. */
  do
    saved_flags = fcntl(fd, F_GETFL);
  while (saved_flags == -1 && errno == EINTR);

  if (saved_flags == -1) {
    if (newfd != -1)
      uv__close(newfd);
    return -errno;
  }
#endif

  /* Pacify the compiler. */
  (void) &saved_flags;

skip:
  uv__stream_init(loop, (uv_stream_t*) tty, UV_TTY);

  /* If anything fails beyond this point we need to remove the handle from
   * the handle queue, since it was added by uv__handle_init in uv_stream_init.
   */

  if (!(flags & UV_STREAM_BLOCKING))
    uv__nonblock(fd, 1);

#if defined(__APPLE__)
  r = uv__stream_try_select((uv_stream_t*) tty, &fd);
  if (r) {
    int rc = r;
    if (newfd != -1)
      uv__close(newfd);
    QUEUE_REMOVE(&tty->handle_queue);
    do
      r = fcntl(fd, F_SETFL, saved_flags);
    while (r == -1 && errno == EINTR);
    return rc;
  }
#endif

  if (readable)
    flags |= UV_STREAM_READABLE;
  else
    flags |= UV_STREAM_WRITABLE;

  uv__stream_open((uv_stream_t*) tty, fd, flags);
  tty->mode = UV_TTY_MODE_NORMAL;

  return 0;
}